

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::EndColumns(void)

{
  float fVar1;
  ImGuiWindow *pIVar2;
  ImGuiColumns *pIVar3;
  ImGuiColumns *pIVar4;
  ImGuiColumnData *pIVar5;
  ImGuiCol idx;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  ImU32 col;
  int iVar9;
  ulong uVar10;
  int column_index;
  ImGuiContext *g;
  long lVar11;
  ImGuiID id;
  uint uVar12;
  float fVar13;
  float fVar14;
  bool held;
  bool hovered;
  ImRect column_hit_rect;
  bool local_a6;
  bool local_a5;
  uint local_a4;
  ulong local_a0;
  float local_94;
  ImGuiContext *local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImRect local_78;
  float local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  
  pIVar7 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  pIVar2->WriteAccessed = true;
  pIVar3 = (pIVar2->DC).CurrentColumns;
  PopItemWidth();
  if (1 < pIVar3->Count) {
    PopClipRect();
    ImDrawListSplitter::Merge(&pIVar2->DrawList->_Splitter,pIVar2->DrawList);
  }
  local_a4 = pIVar3->Flags;
  fVar13 = (pIVar2->DC).CursorPos.y;
  uVar12 = -(uint)(fVar13 <= pIVar3->LineMaxY);
  local_68 = (float)(~uVar12 & (uint)fVar13 | (uint)pIVar3->LineMaxY & uVar12);
  pIVar3->LineMaxY = local_68;
  (pIVar2->DC).CursorPos.y = local_68;
  if ((local_a4 & 0x10) == 0) {
    (pIVar2->DC).CursorMaxPos.x = pIVar3->HostCursorMaxPosX;
  }
  if ((((local_a4 & 1) == 0) && (pIVar2->SkipItems == false)) && (1 < pIVar3->Count)) {
    local_90 = pIVar7;
    fVar13 = (pIVar2->ClipRect).Min.y;
    uVar12 = -(uint)(fVar13 <= pIVar3->HostCursorPosY);
    fVar14 = (pIVar2->ClipRect).Max.y;
    if (fVar14 <= local_68) {
      local_68 = fVar14;
    }
    uStack_64 = 0;
    uStack_60 = 0;
    uStack_5c = 0;
    local_58 = (float)(~uVar12 & (uint)fVar13 | (uint)pIVar3->HostCursorPosY & uVar12);
    uStack_54 = 0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_94 = local_58 + 1.0;
    local_a0 = 0xffffffff;
    uVar10 = 1;
    lVar11 = 0;
    do {
      pIVar4 = (GImGui->CurrentWindow->DC).CurrentColumns;
      if (pIVar4 == (ImGuiColumns *)0x0) {
        local_78.Max.x = 0.0;
      }
      else {
        local_78.Max.x =
             (pIVar4->OffMaxX - pIVar4->OffMinX) *
             *(float *)((long)&(pIVar4->Columns).Data[1].OffsetNorm + lVar11) + pIVar4->OffMinX;
      }
      pIVar5 = (pIVar3->Columns).Data;
      local_78.Max.x = local_78.Max.x + (pIVar2->Pos).x;
      id = pIVar3->ID + (int)uVar10;
      local_78.Min.x = local_78.Max.x + -4.0;
      local_48 = ZEXT416((uint)local_78.Max.x);
      local_78.Max.x = local_78.Max.x + 4.0;
      local_78.Min.y = local_58;
      local_78.Max.y = local_68;
      KeepAliveID(id);
      bVar8 = IsClippedEx(&local_78,id,false);
      if (!bVar8) {
        local_a5 = false;
        local_a6 = false;
        if ((local_a4 & 2) == 0) {
          ButtonBehavior(&local_78,id,&local_a5,&local_a6,0);
          if (local_a5 == false) {
            if ((local_a6 & 1U) != 0) {
              local_90->MouseCursor = 4;
              goto LAB_001962aa;
            }
          }
          else {
            local_90->MouseCursor = 4;
            if ((local_a6 & 1U) != 0) {
LAB_001962aa:
              if ((*(byte *)((long)&pIVar5[1].Flags + lVar11) & 2) == 0) {
                local_a0 = uVar10;
              }
              local_a0 = local_a0 & 0xffffffff;
            }
          }
        }
        idx = local_a5 + 0x1b;
        if ((local_a6 & 1U) != 0) {
          idx = 0x1d;
        }
        col = GetColorU32(idx,1.0);
        local_88.x = (float)(int)(float)local_48._0_4_;
        local_80.y = local_94;
        local_88.y = local_68;
        local_80.x = local_88.x;
        ImDrawList::AddLine(pIVar2->DrawList,&local_80,&local_88,col,1.0);
      }
      uVar10 = uVar10 + 1;
      uVar12 = pIVar3->Count;
      lVar11 = lVar11 + 0x1c;
    } while ((long)uVar10 < (long)(int)uVar12);
    column_index = (int)local_a0;
    if (column_index != -1) {
      if ((-1 < (int)uVar12) && (pIVar3->IsBeingResized == false)) {
        pIVar5 = (pIVar3->Columns).Data;
        lVar11 = 0;
        do {
          *(undefined4 *)((long)&pIVar5->OffsetNormBeforeResize + lVar11) =
               *(undefined4 *)((long)&pIVar5->OffsetNorm + lVar11);
          lVar11 = lVar11 + 0x1c;
        } while ((ulong)uVar12 * 0x1c + 0x1c != lVar11);
      }
      pIVar3->IsBeingResized = true;
      fVar13 = (((GImGui->IO).MousePos.x - (GImGui->ActiveIdClickOffset).x) + 4.0) -
               (GImGui->CurrentWindow->Pos).x;
      pIVar4 = (GImGui->CurrentWindow->DC).CurrentColumns;
      if (pIVar4 == (ImGuiColumns *)0x0) {
        fVar14 = 0.0;
      }
      else {
        if (column_index < 1) {
          iVar9 = pIVar4->Current;
        }
        else {
          iVar9 = column_index + -1;
        }
        fVar14 = (pIVar4->OffMaxX - pIVar4->OffMinX) * (pIVar4->Columns).Data[iVar9].OffsetNorm +
                 pIVar4->OffMinX;
      }
      fVar1 = (GImGui->Style).ColumnsMinSpacing;
      fVar14 = fVar14 + fVar1;
      uVar12 = -(uint)(fVar14 <= fVar13);
      fVar13 = (float)(uVar12 & (uint)fVar13 | ~uVar12 & (uint)fVar14);
      if ((pIVar3->Flags & 4) != 0) {
        if (pIVar4 == (ImGuiColumns *)0x0) {
          fVar14 = 0.0;
        }
        else {
          if (column_index < -1) {
            iVar9 = pIVar4->Current;
          }
          else {
            iVar9 = column_index + 1;
          }
          fVar14 = (pIVar4->OffMaxX - pIVar4->OffMinX) * (pIVar4->Columns).Data[iVar9].OffsetNorm +
                   pIVar4->OffMinX;
        }
        fVar14 = fVar14 - fVar1;
        if (fVar14 <= fVar13) {
          fVar13 = fVar14;
        }
      }
      bVar8 = column_index != -1;
      SetColumnOffset(column_index,fVar13);
      goto LAB_001963c4;
    }
  }
  bVar8 = false;
LAB_001963c4:
  pIVar3->IsBeingResized = bVar8;
  IVar6 = (pIVar3->HostWorkRect).Max;
  (pIVar2->WorkRect).Min = (pIVar3->HostWorkRect).Min;
  (pIVar2->WorkRect).Max = IVar6;
  (pIVar2->DC).CurrentColumns = (ImGuiColumns *)0x0;
  (pIVar2->DC).ColumnsOffset.x = 0.0;
  (pIVar2->DC).CursorPos.x = (float)(int)((pIVar2->Pos).x + (pIVar2->DC).Indent.x + 0.0);
  return;
}

Assistant:

void ImGui::EndColumns()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    ImGuiColumns* columns = window->DC.CurrentColumns;
    IM_ASSERT(columns != NULL);

    PopItemWidth();
    if (columns->Count > 1)
    {
        PopClipRect();
        window->DrawList->ChannelsMerge();
    }

    const ImGuiColumnsFlags flags = columns->Flags;
    columns->LineMaxY = ImMax(columns->LineMaxY, window->DC.CursorPos.y);
    window->DC.CursorPos.y = columns->LineMaxY;
    if (!(flags & ImGuiColumnsFlags_GrowParentContentsSize))
        window->DC.CursorMaxPos.x = columns->HostCursorMaxPosX;  // Restore cursor max pos, as columns don't grow parent

    // Draw columns borders and handle resize
    // The IsBeingResized flag ensure we preserve pre-resize columns width so back-and-forth are not lossy
    bool is_being_resized = false;
    if (!(flags & ImGuiColumnsFlags_NoBorder) && !window->SkipItems)
    {
        // We clip Y boundaries CPU side because very long triangles are mishandled by some GPU drivers.
        const float y1 = ImMax(columns->HostCursorPosY, window->ClipRect.Min.y);
        const float y2 = ImMin(window->DC.CursorPos.y, window->ClipRect.Max.y);
        int dragging_column = -1;
        for (int n = 1; n < columns->Count; n++)
        {
            ImGuiColumnData* column = &columns->Columns[n];
            float x = window->Pos.x + GetColumnOffset(n);
            const ImGuiID column_id = columns->ID + ImGuiID(n);
            const float column_hit_hw = COLUMNS_HIT_RECT_HALF_WIDTH;
            const ImRect column_hit_rect(ImVec2(x - column_hit_hw, y1), ImVec2(x + column_hit_hw, y2));
            KeepAliveID(column_id);
            if (IsClippedEx(column_hit_rect, column_id, false))
                continue;

            bool hovered = false, held = false;
            if (!(flags & ImGuiColumnsFlags_NoResize))
            {
                ButtonBehavior(column_hit_rect, column_id, &hovered, &held);
                if (hovered || held)
                    g.MouseCursor = ImGuiMouseCursor_ResizeEW;
                if (held && !(column->Flags & ImGuiColumnsFlags_NoResize))
                    dragging_column = n;
            }

            // Draw column
            const ImU32 col = GetColorU32(held ? ImGuiCol_SeparatorActive : hovered ? ImGuiCol_SeparatorHovered : ImGuiCol_Separator);
            const float xi = IM_FLOOR(x);
            window->DrawList->AddLine(ImVec2(xi, y1 + 1.0f), ImVec2(xi, y2), col);
        }

        // Apply dragging after drawing the column lines, so our rendered lines are in sync with how items were displayed during the frame.
        if (dragging_column != -1)
        {
            if (!columns->IsBeingResized)
                for (int n = 0; n < columns->Count + 1; n++)
                    columns->Columns[n].OffsetNormBeforeResize = columns->Columns[n].OffsetNorm;
            columns->IsBeingResized = is_being_resized = true;
            float x = GetDraggedColumnOffset(columns, dragging_column);
            SetColumnOffset(dragging_column, x);
        }
    }
    columns->IsBeingResized = is_being_resized;

    window->WorkRect = columns->HostWorkRect;
    window->DC.CurrentColumns = NULL;
    window->DC.ColumnsOffset.x = 0.0f;
    window->DC.CursorPos.x = IM_FLOOR(window->Pos.x + window->DC.Indent.x + window->DC.ColumnsOffset.x);
}